

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constbuffer.c
# Opt level: O0

CONSTBUFFER_HANDLE CONSTBUFFER_Create_Internal(uchar *source,size_t size)

{
  LOGGER_LOG p_Var1;
  uchar *temp;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t malloc_size;
  CONSTBUFFER_HANDLE result;
  size_t size_local;
  uchar *source_local;
  
  if (size + 0x30 < size) {
    malloc_size = 0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/constbuffer.c"
                ,"CONSTBUFFER_Create_Internal",0x28,1,"invalid size parameter");
    }
  }
  else {
    malloc_size = (size_t)calloc(1,size + 0x30);
  }
  if (malloc_size == 0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/constbuffer.c"
                ,"CONSTBUFFER_Create_Internal",0x34,1,"unable to malloc");
    }
  }
  else {
    *(undefined4 *)(malloc_size + 0x10) = 1;
    *(size_t *)(malloc_size + 8) = size;
    if (size == 0) {
      *(undefined8 *)malloc_size = 0;
    }
    else {
      memcpy((void *)(malloc_size + 0x30),source,size);
      *(void **)malloc_size = (void *)(malloc_size + 0x30);
    }
    *(undefined4 *)(malloc_size + 0x14) = 1;
  }
  return (CONSTBUFFER_HANDLE)malloc_size;
}

Assistant:

static CONSTBUFFER_HANDLE CONSTBUFFER_Create_Internal(const unsigned char* source, size_t size)
{
    CONSTBUFFER_HANDLE result;
    /*Codes_SRS_CONSTBUFFER_02_005: [The non-NULL handle returned by CONSTBUFFER_Create shall have its ref count set to "1".]*/
    /*Codes_SRS_CONSTBUFFER_02_010: [The non-NULL handle returned by CONSTBUFFER_CreateFromBuffer shall have its ref count set to "1".]*/
    size_t malloc_size = sizeof(CONSTBUFFER_HANDLE_DATA) + size;
    if (malloc_size < size)
    {
        result = NULL;
        LogError("invalid size parameter");
        /*return as is*/
    }
    else
    {
        result = (CONSTBUFFER_HANDLE)calloc(1, malloc_size);
    }

    if (result == NULL)
    {
        /*Codes_SRS_CONSTBUFFER_02_003: [If creating the copy fails then CONSTBUFFER_Create shall return NULL.]*/
        /*Codes_SRS_CONSTBUFFER_02_008: [If copying the content fails, then CONSTBUFFER_CreateFromBuffer shall fail and return NULL.] */
        LogError("unable to malloc");
        /*return as is*/
    }
    else
    {
        INIT_REF_VAR(result->count);

        /*Codes_SRS_CONSTBUFFER_02_002: [Otherwise, CONSTBUFFER_Create shall create a copy of the memory area pointed to by source having size bytes.]*/
        result->alias.size = size;
        if (size == 0)
        {
            result->alias.buffer = NULL;
        }
        else
        {
            unsigned char* temp = (unsigned char*)(result + 1);
            /*Codes_SRS_CONSTBUFFER_02_004: [Otherwise CONSTBUFFER_Create shall return a non-NULL handle.]*/
            /*Codes_SRS_CONSTBUFFER_02_007: [Otherwise, CONSTBUFFER_CreateFromBuffer shall copy the content of buffer.]*/
            /*Codes_SRS_CONSTBUFFER_02_009: [Otherwise, CONSTBUFFER_CreateFromBuffer shall return a non-NULL handle.]*/
            (void)memcpy(temp, source, size);
            result->alias.buffer = temp;
        }

        result->buffer_type = CONSTBUFFER_TYPE_COPIED;
    }
    return result;
}